

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log_Scope.h
# Opt level: O1

void __thiscall Nova::Log::Log_Scope::Dump_Names(Log_Scope *this,FILE *output)

{
  pointer ppLVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  Log_Entry::Dump_Names(&this->super_Log_Entry,output);
  ppLVar1 = (this->children)._data.
            super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(this->children)._data.
                super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1;
  if (lVar2 != 0) {
    uVar3 = lVar2 >> 3;
    uVar4 = 0;
    do {
      if (uVar3 <= uVar4) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4
                  );
      }
      (*ppLVar1[uVar4]->_vptr_Log_Entry[8])(ppLVar1[uVar4],output);
      uVar4 = uVar4 + 1;
      ppLVar1 = (this->children)._data.
                super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(this->children)._data.
                    super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3;
    } while (uVar4 < uVar3);
  }
  return;
}

Assistant:

void Dump_Names(FILE* output)
    {Log_Entry::Dump_Names(output);for(int i=0;i<children.size();++i)children(i)->Dump_Names(output);}